

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O3

void __thiscall polyscope::SurfaceMesh::buildCornerInfoGui(SurfaceMesh *this,size_t cInd)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  long *plVar4;
  _Rb_tree_node_base *p_Var5;
  long *plVar6;
  size_t sVar7;
  long *text;
  float fVar8;
  string __str;
  long local_50;
  long lStack_48;
  char *local_40;
  uint local_38;
  char local_30 [16];
  
  cVar3 = '\x01';
  if (9 < cInd) {
    sVar7 = cInd;
    cVar2 = '\x04';
    do {
      cVar3 = cVar2;
      if (sVar7 < 100) {
        cVar3 = cVar3 + -2;
        goto LAB_002447ea;
      }
      if (sVar7 < 1000) {
        cVar3 = cVar3 + -1;
        goto LAB_002447ea;
      }
      if (sVar7 < 10000) goto LAB_002447ea;
      bVar1 = 99999 < sVar7;
      sVar7 = sVar7 / 10000;
      cVar2 = cVar3 + '\x04';
    } while (bVar1);
    cVar3 = cVar3 + '\x01';
  }
LAB_002447ea:
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,cVar3);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_40,local_38,cInd);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x347cb6);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_50 = *plVar6;
    lStack_48 = plVar4[3];
    text = &local_50;
  }
  else {
    local_50 = *plVar6;
    text = (long *)*plVar4;
  }
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  ImGui::TextUnformatted((char *)text,(char *)0x0);
  if (text != &local_50) {
    operator_delete(text);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Indent(20.0);
  ImGui::Columns(2,(char *)0x0,true);
  fVar8 = ImGui::GetWindowWidth();
  ImGui::SetColumnWidth(0,fVar8 / 3.0);
  for (p_Var5 = *(_Rb_tree_node_base **)
                 &(this->super_QuantityStructure<polyscope::SurfaceMesh>).super_Structure.
                  field_0x3d8;
      p_Var5 != (_Rb_tree_node_base *)
                &(this->super_QuantityStructure<polyscope::SurfaceMesh>).super_Structure.field_0x3c8
      ; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    (**(code **)(**(long **)(p_Var5 + 2) + 0x70))();
  }
  ImGui::Indent(-20.0);
  ImGui::Columns(1,(char *)0x0,true);
  return;
}

Assistant:

void SurfaceMesh::buildCornerInfoGui(size_t cInd) {
  size_t displayInd = cInd;
  ImGui::TextUnformatted(("Corner #" + std::to_string(displayInd)).c_str());

  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Indent(20.);

  // Build GUI to show the quantities
  ImGui::Columns(2);
  ImGui::SetColumnWidth(0, ImGui::GetWindowWidth() / 3);
  for (auto& x : quantities) {
    x.second->buildCornerInfoGUI(cInd);
  }

  ImGui::Indent(-20.);
  ImGui::Columns(1);
}